

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::del_by_key(mpp_list *this,void *data,RK_S32 size,RK_U32 key)

{
  mpp_list_node *node;
  mpp_list_node *tmp;
  RK_S32 ret;
  RK_U32 key_local;
  RK_S32 size_local;
  void *data_local;
  mpp_list *this_local;
  
  tmp._4_4_ = 0;
  if ((this->head != (mpp_list_node *)0x0) && (this->count != 0)) {
    node = this->head->next;
    tmp._4_4_ = -0x16;
    do {
      if (node->next == this->head) {
        return -0x16;
      }
    } while (node->key != key);
    _list_del_node_no_lock(node,data,size);
    this->count = this->count + -1;
  }
  return tmp._4_4_;
}

Assistant:

RK_S32 mpp_list::del_by_key(void *data, RK_S32 size, RK_U32 key)
{
    RK_S32 ret = 0;
    if (head && count) {
        struct mpp_list_node *tmp = head->next;
        ret = -EINVAL;
        while (tmp->next != head) {
            if (tmp->key == key) {
                _list_del_node_no_lock(tmp, data, size);
                count--;
                break;
            }
        }
    }
    return ret;
}